

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void __thiscall amrex::BoxArray::BoxArray(BoxArray *this,BoxList *bl)

{
  IndexType IVar1;
  BoxList *in_RSI;
  undefined8 in_RDI;
  IndexType t;
  BATransformer *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  
  t.itype = (uint)((ulong)in_RDI >> 0x20);
  IVar1 = BoxList::ixType(in_RSI);
  BATransformer::BATransformer(in_stack_ffffffffffffffc8,t);
  std::make_shared<amrex::BARef,amrex::BoxList_const&>
            ((BoxList *)CONCAT44(IVar1.itype,in_stack_ffffffffffffffe8));
  std::shared_ptr<amrex::BoxList>::shared_ptr((shared_ptr<amrex::BoxList> *)0x1251a3f);
  type_update((BoxArray *)CONCAT44(IVar1.itype,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

BoxArray::BoxArray (const BoxList& bl)
    :
    m_bat(bl.ixType()),
    m_ref(std::make_shared<BARef>(bl))
{
    type_update();
}